

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.h
# Opt level: O2

void __thiscall
embree::avx::UnalignedHeuristicArrayBinningSAH<embree::PrimRef,_32UL>::splitFallback
          (UnalignedHeuristicArrayBinningSAH<embree::PrimRef,_32UL> *this,range<unsigned_long> *set,
          PrimInfoRange *lset,PrimInfoRange *rset)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  undefined1 auVar4 [16];
  Vec3fx VVar5;
  unsigned_long uVar6;
  ulong uVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar9;
  ulong uVar10;
  ulong uVar11;
  unsigned_long uVar12;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar13;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar14;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar15;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  uVar6 = set->_begin;
  uVar7 = set->_end;
  uVar10 = uVar7 + uVar6 >> 1;
  paVar9 = &this->prims[uVar6].upper.field_0;
  aVar15.m128[2] = INFINITY;
  aVar15._0_8_ = 0x7f8000007f800000;
  aVar15.m128[3] = INFINITY;
  aVar13.m128[2] = -INFINITY;
  aVar13._0_8_ = 0xff800000ff800000;
  aVar13.m128[3] = -INFINITY;
  aVar8 = aVar13;
  aVar14 = aVar15;
  for (uVar12 = uVar6; uVar12 < uVar10; uVar12 = uVar12 + 1) {
    aVar2 = paVar9[-1].field_1;
    aVar3 = paVar9->field_1;
    aVar14.m128 = (__m128)vminps_avx(aVar14.m128,(undefined1  [16])aVar2);
    aVar8.m128 = (__m128)vmaxps_avx(aVar8.m128,(undefined1  [16])aVar3);
    auVar17._0_4_ = aVar2.x + aVar3.x;
    auVar17._4_4_ = aVar2.y + aVar3.y;
    auVar17._8_4_ = aVar2.z + aVar3.z;
    auVar17._12_4_ = aVar2.field_3.w + aVar3.field_3.w;
    aVar15.m128 = (__m128)vminps_avx(aVar15.m128,auVar17);
    aVar13.m128 = (__m128)vmaxps_avx(aVar13.m128,auVar17);
    paVar9 = paVar9 + 2;
  }
  (lset->super_CentGeomBBox3fa).geomBounds.lower.field_0 = aVar14;
  (lset->super_CentGeomBBox3fa).geomBounds.upper.field_0 = aVar8;
  (lset->super_CentGeomBBox3fa).centBounds.lower.field_0 = aVar15;
  (lset->super_CentGeomBBox3fa).centBounds.upper.field_0 = aVar13;
  (lset->super_range<unsigned_long>)._begin = uVar6;
  (lset->super_range<unsigned_long>)._end = uVar10;
  paVar9 = &this->prims[uVar10].upper.field_0;
  aVar16.m128[2] = INFINITY;
  aVar16._0_8_ = 0x7f8000007f800000;
  aVar16.m128[3] = INFINITY;
  aVar14.m128[2] = -INFINITY;
  aVar14._0_8_ = 0xff800000ff800000;
  aVar14.m128[3] = -INFINITY;
  aVar8 = aVar14;
  aVar13 = aVar16;
  for (uVar11 = uVar10; uVar11 < uVar7; uVar11 = uVar11 + 1) {
    paVar1 = paVar9 + -1;
    auVar4._0_4_ = *(float *)paVar1;
    auVar4._4_4_ = *(float *)((long)paVar1 + 4);
    auVar4._8_4_ = *(float *)((long)paVar1 + 8);
    auVar4._12_4_ =
         *(anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
           *)((long)paVar1 + 0xc);
    VVar5.field_0 =
         (anon_union_16_2_47237d3f_for_Vec3fx_0)
         *(anon_union_16_2_47237d3f_for_Vec3fx_0 *)&paVar9->field_1;
    aVar13.m128 = (__m128)vminps_avx(aVar13.m128,auVar4);
    aVar8.m128 = (__m128)vmaxps_avx(aVar8.m128,(undefined1  [16])VVar5.field_0);
    auVar18._0_4_ = (float)auVar4._0_4_ + VVar5.field_0._0_4_;
    auVar18._4_4_ = (float)auVar4._4_4_ + VVar5.field_0._4_4_;
    auVar18._8_4_ = (float)auVar4._8_4_ + VVar5.field_0._8_4_;
    auVar18._12_4_ = (float)auVar4._12_4_ + VVar5.field_0._12_4_;
    aVar16.m128 = (__m128)vminps_avx(aVar16.m128,auVar18);
    aVar14.m128 = (__m128)vmaxps_avx(aVar14.m128,auVar18);
    paVar9 = paVar9 + 2;
  }
  (rset->super_CentGeomBBox3fa).geomBounds.lower.field_0 = aVar13;
  (rset->super_CentGeomBBox3fa).geomBounds.upper.field_0 = aVar8;
  (rset->super_CentGeomBBox3fa).centBounds.lower.field_0 = aVar16;
  (rset->super_CentGeomBBox3fa).centBounds.upper.field_0 = aVar14;
  (rset->super_range<unsigned_long>)._begin = uVar10;
  (rset->super_range<unsigned_long>)._end = uVar7;
  return;
}

Assistant:

__forceinline Ty begin() const {
        return _begin;
      }